

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

void __thiscall wallet::SQLiteDatabase::Cleanup(SQLiteDatabase *this)

{
  string_view source_file;
  bool bVar1;
  int iVar2;
  Logger *pLVar3;
  char **in_RCX;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  string log_msg;
  undefined8 local_e8 [2];
  unique_lock<std::mutex> local_d8 [7];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->super_WalletDatabase)._vptr_WalletDatabase[8])();
  local_d8[0]._M_device = (mutex_type *)g_sqlite_mutex;
  local_d8[0]._M_owns = false;
  std::unique_lock<std::mutex>::lock(local_d8);
  g_sqlite_count = g_sqlite_count + -1;
  if (g_sqlite_count == 0) {
    iVar2 = sqlite3_shutdown();
    if (iVar2 != 0) {
      local_e8[0] = sqlite3_errstr(iVar2);
      pLVar3 = LogInstance();
      bVar1 = BCLog::Logger::Enabled(pLVar3);
      if (bVar1) {
        local_48._M_string_length = 0;
        local_48.field_2._M_local_buf[0] = '\0';
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        tinyformat::format<char_const*>
                  (&local_68,(tinyformat *)"SQLiteDatabase: Failed to shutdown SQLite: %s\n",
                   (char *)local_e8,in_RCX);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_48,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pLVar3 = LogInstance();
        local_68._M_dataplus._M_p = (pointer)0x5a;
        local_68._M_string_length = 0x4a74cc;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
        ;
        source_file._M_len = 0x5a;
        str._M_str = local_48._M_dataplus._M_p;
        str._M_len = local_48._M_string_length;
        logging_function._M_str = "Cleanup";
        logging_function._M_len = 7;
        BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0xb9,ALL,Info);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,
                          CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                   local_48.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SQLiteDatabase::Cleanup() noexcept
{
    AssertLockNotHeld(g_sqlite_mutex);

    Close();

    LOCK(g_sqlite_mutex);
    if (--g_sqlite_count == 0) {
        int ret = sqlite3_shutdown();
        if (ret != SQLITE_OK) {
            LogPrintf("SQLiteDatabase: Failed to shutdown SQLite: %s\n", sqlite3_errstr(ret));
        }
    }
}